

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BeagleCPU4StateImpl.hpp
# Opt level: O2

int __thiscall
beagle::cpu::BeagleCPU4StateImpl<double,_1,_0>::calcEdgeLogLikelihoods
          (BeagleCPU4StateImpl<double,_1,_0> *this,int parIndex,int childIndex,int probIndex,
          int categoryWeightsIndex,int stateFrequenciesIndex,int scalingFactorsIndex,
          double *outSumLogLikelihood)

{
  undefined8 *puVar1;
  double dVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  uint uVar16;
  uint uVar17;
  int iVar18;
  double *pdVar19;
  double *pdVar20;
  double *pdVar21;
  int *piVar22;
  double *pdVar23;
  double *pdVar24;
  int iVar25;
  double *partials1;
  uint uVar26;
  long lVar27;
  ulong uVar28;
  int iVar29;
  int iVar30;
  long lVar31;
  long lVar32;
  bool bVar33;
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  
  pdVar19 = (this->super_BeagleCPUImpl<double,_1,_0>).gPartials[parIndex];
  pdVar20 = (this->super_BeagleCPUImpl<double,_1,_0>).gTransitionMatrices[probIndex];
  pdVar21 = (this->super_BeagleCPUImpl<double,_1,_0>).gCategoryWeights[categoryWeightsIndex];
  memset((this->super_BeagleCPUImpl<double,_1,_0>).integrationTmp,0,
         (long)(this->super_BeagleCPUImpl<double,_1,_0>).kStateCount *
         (long)(this->super_BeagleCPUImpl<double,_1,_0>).kPatternCount * 8);
  if ((childIndex < (this->super_BeagleCPUImpl<double,_1,_0>).kTipCount) &&
     (piVar22 = (this->super_BeagleCPUImpl<double,_1,_0>).gTipStates[childIndex],
     piVar22 != (int *)0x0)) {
    uVar16 = (this->super_BeagleCPUImpl<double,_1,_0>).kCategoryCount;
    iVar25 = (this->super_BeagleCPUImpl<double,_1,_0>).kExtraPatterns;
    uVar17 = (this->super_BeagleCPUImpl<double,_1,_0>).kPatternCount;
    iVar29 = 0;
    iVar30 = 0;
    for (uVar28 = 0; uVar28 != (~((int)uVar16 >> 0x1f) & uVar16); uVar28 = uVar28 + 1) {
      pdVar23 = (this->super_BeagleCPUImpl<double,_1,_0>).integrationTmp;
      auVar34._8_8_ = 0;
      auVar34._0_8_ = pdVar21[uVar28];
      for (lVar31 = 0; (ulong)(~((int)uVar17 >> 0x1f) & uVar17) << 2 != lVar31; lVar31 = lVar31 + 4)
      {
        iVar18 = *(int *)((long)piVar22 + lVar31);
        auVar35._8_8_ = 0;
        auVar35._0_8_ = pdVar23[lVar31];
        auVar39._8_8_ = 0;
        auVar39._0_8_ = pdVar20[iVar18 + iVar29] * pdVar19[iVar30 + lVar31];
        auVar35 = vfmadd213sd_fma(auVar39,auVar34,auVar35);
        pdVar23[lVar31] = auVar35._0_8_;
        auVar36._8_8_ = 0;
        auVar36._0_8_ = pdVar23[lVar31 + 1];
        auVar40._8_8_ = 0;
        auVar40._0_8_ = pdVar20[iVar29 + 5 + iVar18] * pdVar19[(long)iVar30 + lVar31 + 1];
        auVar35 = vfmadd213sd_fma(auVar40,auVar34,auVar36);
        pdVar23[lVar31 + 1] = auVar35._0_8_;
        auVar37._8_8_ = 0;
        auVar37._0_8_ = pdVar23[lVar31 + 2];
        auVar41._8_8_ = 0;
        auVar41._0_8_ = pdVar20[iVar29 + 10 + iVar18] * pdVar19[(long)iVar30 + lVar31 + 2];
        auVar35 = vfmadd213sd_fma(auVar41,auVar34,auVar37);
        pdVar23[lVar31 + 2] = auVar35._0_8_;
        auVar7._8_8_ = 0;
        auVar7._0_8_ = pdVar23[lVar31 + 3];
        auVar42._8_8_ = 0;
        auVar42._0_8_ = pdVar20[iVar18 + iVar29 + 0xf] * pdVar19[(long)iVar30 + lVar31 + 3];
        auVar35 = vfmadd213sd_fma(auVar42,auVar34,auVar7);
        pdVar23[lVar31 + 3] = auVar35._0_8_;
      }
      iVar29 = iVar29 + 0x14;
      iVar30 = (int)lVar31 + iVar30 + iVar25 * 4;
    }
  }
  else {
    uVar16 = (this->super_BeagleCPUImpl<double,_1,_0>).kPatternCount;
    uVar17 = (this->super_BeagleCPUImpl<double,_1,_0>).kCategoryCount;
    pdVar23 = (this->super_BeagleCPUImpl<double,_1,_0>).gPartials[childIndex];
    iVar25 = (this->super_BeagleCPUImpl<double,_1,_0>).kPaddedPatternCount;
    lVar31 = 0;
    iVar29 = 0;
    for (uVar28 = 0; uVar28 != (~((int)uVar17 >> 0x1f) & uVar17); uVar28 = uVar28 + 1) {
      lVar27 = (long)iVar29;
      auVar43._8_8_ = 0;
      auVar43._0_8_ = pdVar20[lVar31];
      auVar44._8_8_ = 0;
      auVar44._0_8_ = pdVar20[lVar31 + 1];
      auVar45._8_8_ = 0;
      auVar45._0_8_ = pdVar20[lVar31 + 2];
      auVar46._8_8_ = 0;
      auVar46._0_8_ = pdVar20[lVar31 + 3];
      auVar47._8_8_ = 0;
      auVar47._0_8_ = pdVar20[lVar31 + 5];
      auVar48._8_8_ = 0;
      auVar48._0_8_ = pdVar20[lVar31 + 6];
      auVar49._8_8_ = 0;
      auVar49._0_8_ = pdVar20[lVar31 + 7];
      auVar50._8_8_ = 0;
      auVar50._0_8_ = pdVar20[lVar31 + 8];
      auVar51._8_8_ = 0;
      auVar51._0_8_ = pdVar20[lVar31 + 10];
      auVar52._8_8_ = 0;
      auVar52._0_8_ = pdVar20[lVar31 + 0xb];
      auVar53._8_8_ = 0;
      auVar53._0_8_ = pdVar20[lVar31 + 0xc];
      auVar54._8_8_ = 0;
      auVar54._0_8_ = pdVar20[lVar31 + 0xd];
      auVar55._8_8_ = 0;
      auVar55._0_8_ = pdVar20[lVar31 + 0xf];
      auVar56._8_8_ = 0;
      auVar56._0_8_ = pdVar20[lVar31 + 0x10];
      auVar57._8_8_ = 0;
      auVar57._0_8_ = pdVar20[lVar31 + 0x11];
      dVar2 = pdVar20[lVar31 + 0x12];
      pdVar24 = (this->super_BeagleCPUImpl<double,_1,_0>).integrationTmp;
      auVar38._8_8_ = 0;
      auVar38._0_8_ = pdVar21[uVar28];
      lVar32 = 0x18;
      uVar26 = ~((int)uVar16 >> 0x1f) & uVar16;
      while (bVar33 = uVar26 != 0, uVar26 = uVar26 - 1, bVar33) {
        uVar3 = *(ulong *)((long)pdVar23 + lVar32 + lVar27 * 8 + -0x10);
        uVar4 = *(ulong *)((long)pdVar23 + lVar32 + lVar27 * 8 + -0x18);
        uVar5 = *(ulong *)((long)pdVar23 + lVar32 + lVar27 * 8 + -8);
        uVar6 = *(ulong *)((long)pdVar23 + lVar32 + lVar27 * 8);
        auVar61._8_8_ = 0;
        auVar61._0_8_ = uVar3;
        auVar34 = vmulsd_avx512f(auVar44,auVar61);
        auVar35 = vmulsd_avx512f(auVar48,auVar61);
        auVar62._8_8_ = 0;
        auVar62._0_8_ = uVar3;
        auVar36 = vmulsd_avx512f(auVar52,auVar62);
        auVar37 = vmulsd_avx512f(auVar56,auVar62);
        auVar59._8_8_ = 0;
        auVar59._0_8_ = uVar4;
        auVar34 = vfmadd231sd_avx512f(auVar34,auVar43,auVar59);
        auVar35 = vfmadd231sd_avx512f(auVar35,auVar47,auVar59);
        auVar60._8_8_ = 0;
        auVar60._0_8_ = uVar4;
        auVar36 = vfmadd231sd_avx512f(auVar36,auVar51,auVar60);
        auVar37 = vfmadd231sd_avx512f(auVar37,auVar55,auVar60);
        auVar63._8_8_ = 0;
        auVar63._0_8_ = uVar5;
        auVar34 = vfmadd231sd_avx512f(auVar34,auVar45,auVar63);
        auVar35 = vfmadd231sd_avx512f(auVar35,auVar49,auVar63);
        auVar64._8_8_ = 0;
        auVar64._0_8_ = uVar5;
        auVar36 = vfmadd231sd_avx512f(auVar36,auVar53,auVar64);
        auVar37 = vfmadd231sd_avx512f(auVar37,auVar57,auVar64);
        auVar65._8_8_ = 0;
        auVar65._0_8_ = uVar6;
        auVar34 = vfmadd231sd_avx512f(auVar34,auVar46,auVar65);
        auVar8._8_8_ = 0;
        auVar8._0_8_ = *(ulong *)((long)pdVar19 + lVar32 + lVar27 * 8 + -0x18);
        auVar34 = vmulsd_avx512f(auVar34,auVar8);
        auVar35 = vfmadd231sd_avx512f(auVar35,auVar50,auVar65);
        auVar66._8_8_ = 0;
        auVar66._0_8_ = uVar6;
        auVar36 = vfmadd231sd_avx512f(auVar36,auVar54,auVar66);
        auVar58._8_8_ = 0;
        auVar58._0_8_ = dVar2;
        auVar37 = vfmadd231sd_avx512f(auVar37,auVar58,auVar66);
        auVar9._8_8_ = 0;
        auVar9._0_8_ = *(ulong *)((long)pdVar24 + lVar32 + -0x18);
        auVar34 = vfmadd213sd_avx512f(auVar34,auVar38,auVar9);
        puVar1 = (undefined8 *)((long)pdVar24 + lVar32 + -0x18);
        vmovsd_avx512f(auVar34);
        *puVar1 = *puVar1;
        auVar10._8_8_ = 0;
        auVar10._0_8_ = *(ulong *)((long)pdVar19 + lVar32 + lVar27 * 8 + -0x10);
        auVar34 = vmulsd_avx512f(auVar35,auVar10);
        auVar11._8_8_ = 0;
        auVar11._0_8_ = *(ulong *)((long)pdVar24 + lVar32 + -0x10);
        auVar34 = vfmadd213sd_avx512f(auVar34,auVar38,auVar11);
        puVar1 = (undefined8 *)((long)pdVar24 + lVar32 + -0x10);
        vmovsd_avx512f(auVar34);
        *puVar1 = *puVar1;
        auVar12._8_8_ = 0;
        auVar12._0_8_ = *(ulong *)((long)pdVar19 + lVar32 + lVar27 * 8 + -8);
        auVar34 = vmulsd_avx512f(auVar36,auVar12);
        auVar13._8_8_ = 0;
        auVar13._0_8_ = *(ulong *)((long)pdVar24 + lVar32 + -8);
        auVar34 = vfmadd213sd_avx512f(auVar34,auVar38,auVar13);
        puVar1 = (undefined8 *)((long)pdVar24 + lVar32 + -8);
        vmovsd_avx512f(auVar34);
        *puVar1 = *puVar1;
        auVar14._8_8_ = 0;
        auVar14._0_8_ = *(ulong *)((long)pdVar19 + lVar32 + lVar27 * 8);
        auVar34 = vmulsd_avx512f(auVar37,auVar14);
        auVar15._8_8_ = 0;
        auVar15._0_8_ = *(ulong *)((long)pdVar24 + lVar32);
        auVar34 = vfmadd213sd_avx512f(auVar34,auVar38,auVar15);
        vmovsd_avx512f(auVar34);
        *(undefined8 *)((long)pdVar24 + lVar32) = *(undefined8 *)((long)pdVar24 + lVar32);
        lVar32 = lVar32 + 0x20;
      }
      lVar31 = lVar31 + 0x14;
      iVar29 = iVar29 + iVar25 * 4;
    }
  }
  iVar25 = integrateOutStatesAndScale
                     (this,(this->super_BeagleCPUImpl<double,_1,_0>).integrationTmp,
                      stateFrequenciesIndex,scalingFactorsIndex,outSumLogLikelihood);
  return iVar25;
}

Assistant:

BEAGLE_CPU_TEMPLATE
int BeagleCPU4StateImpl<BEAGLE_CPU_GENERIC>::calcEdgeLogLikelihoods(const int parIndex,
                                                           const int childIndex,
                                                           const int probIndex,
                                                           const int categoryWeightsIndex,
                                                           const int stateFrequenciesIndex,
                                                           const int scalingFactorsIndex,
                                                           double* outSumLogLikelihood) {
    // TODO: implement derivatives for calculateEdgeLnL

    assert(parIndex >= kTipCount);

    const REALTYPE* partialsParent = gPartials[parIndex];
    const REALTYPE* transMatrix = gTransitionMatrices[probIndex];
    const REALTYPE* wt = gCategoryWeights[categoryWeightsIndex];


    memset(integrationTmp, 0, (kPatternCount * kStateCount)*sizeof(REALTYPE));

    if (childIndex < kTipCount && gTipStates[childIndex]) { // Integrate against a state at the child

        const int* statesChild = gTipStates[childIndex];
        int v = 0; // Index for parent partials
        int w = 0;
        for(int l = 0; l < kCategoryCount; l++) {
            int u = 0; // Index in resulting product-partials (summed over categories)
            const REALTYPE weight = wt[l];
            for(int k = 0; k < kPatternCount; k++) {

                const int stateChild = statesChild[k];

                integrationTmp[u    ] += transMatrix[w            + stateChild] * partialsParent[v    ] * weight;
                integrationTmp[u + 1] += transMatrix[w + OFFSET*1 + stateChild] * partialsParent[v + 1] * weight;
                integrationTmp[u + 2] += transMatrix[w + OFFSET*2 + stateChild] * partialsParent[v + 2] * weight;
                integrationTmp[u + 3] += transMatrix[w + OFFSET*3 + stateChild] * partialsParent[v + 3] * weight;

                u += 4;
                v += 4;
            }
            w += OFFSET*4;
            if (kExtraPatterns)
            	v += 4 * kExtraPatterns;
        }

    } else { // Integrate against a partial at the child

        const REALTYPE* partialsChild = gPartials[childIndex];
		#if 0//
        int v = 0;
		#endif
        int w = 0;
        for(int l = 0; l < kCategoryCount; l++) {
            int u = 0;
			#if 1//
			int v = l*kPaddedPatternCount*4;
			#endif
            const REALTYPE weight = wt[l];

            PREFETCH_MATRIX(1,transMatrix,w);

            for(int k = 0; k < kPatternCount; k++) {

                const REALTYPE* partials1 = partialsChild;

                PREFETCH_PARTIALS(1,partials1,v);

                DO_INTEGRATION(1);

                integrationTmp[u    ] += sum10 * partialsParent[v    ] * weight;
                integrationTmp[u + 1] += sum11 * partialsParent[v + 1] * weight;
                integrationTmp[u + 2] += sum12 * partialsParent[v + 2] * weight;
                integrationTmp[u + 3] += sum13 * partialsParent[v + 3] * weight;

                u += 4;
                v += 4;
            }
            w += OFFSET*4;
			#if 0//
            if (kExtraPatterns)
            	v += 4 * kExtraPatterns;
			#endif//
        }
    }

    return integrateOutStatesAndScale(integrationTmp, stateFrequenciesIndex, scalingFactorsIndex, outSumLogLikelihood);
}